

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

int Gia_Truth5ToGia(Gia_Man_t *p,int *pVarLits,int nVars,uint Truth,int fHash)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  
  if (Truth != 0) {
    if (Truth != 0xffffffff) {
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                      ,0x95,"int Gia_Truth5ToGia(Gia_Man_t *, int *, int, unsigned int, int)");
      }
      uVar2 = (ulong)(uint)nVars;
      iVar3 = nVars + -1;
      do {
        iVar4 = iVar3;
        uVar6 = uVar2;
        if ((long)uVar6 < 1) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                        ,0x9a,"int Gia_Truth5ToGia(Gia_Man_t *, int *, int, unsigned int, int)");
        }
        bVar5 = (byte)(1 << ((byte)iVar4 & 0x1f));
        uVar1 = *(uint *)((long)s_Truths6Neg + uVar6 * 4 + 0x2c);
        uVar2 = uVar6 - 1;
        iVar3 = iVar4 + -1;
      } while ((uVar1 & (Truth << (bVar5 & 0x1f) ^ Truth)) == 0);
      if (uVar6 < 7) {
        iVar3 = Gia_Truth5ToGia(p,pVarLits,iVar4,(~uVar1 & Truth) << (bVar5 & 0x1f) | ~uVar1 & Truth
                                ,fHash);
        iVar4 = Gia_Truth5ToGia(p,pVarLits,iVar4,(uVar1 & Truth) >> (bVar5 & 0x1f) | uVar1 & Truth,
                                fHash);
        if (fHash != 0) {
          iVar3 = Gia_ManHashMux(p,pVarLits[uVar6 - 1],iVar4,iVar3);
          return iVar3;
        }
        iVar3 = Gia_ManAppendMux(p,pVarLits[uVar6 - 1],iVar4,iVar3);
        return iVar3;
      }
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                    ,0x86,"unsigned int Abc_Tt5Cofactor0(unsigned int, int)");
    }
    Truth = 1;
  }
  return Truth;
}

Assistant:

int Gia_Truth5ToGia( Gia_Man_t * p, int * pVarLits, int nVars, unsigned Truth, int fHash )
{
    int Var, Lit0, Lit1; 
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
        return 1;
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt5HasVar( Truth, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    Lit0 = Gia_Truth5ToGia( p, pVarLits, Var, Abc_Tt5Cofactor0(Truth, Var), fHash );
    Lit1 = Gia_Truth5ToGia( p, pVarLits, Var, Abc_Tt5Cofactor1(Truth, Var), fHash );
    if ( fHash )
        return Gia_ManHashMux( p, pVarLits[Var], Lit1, Lit0 );
    else
        return Gia_ManAppendMux( p, pVarLits[Var], Lit1, Lit0 );
}